

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ApiColumnSize(Fts5Context *pCtx,int iCol,int *pnToken)

{
  Fts5Config *pConfig;
  u8 *puVar1;
  int iVar2;
  i64 iRowid;
  int iVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  int n;
  char *z;
  int local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)pCtx;
  pConfig = *(Fts5Config **)(lVar4 + 0x18);
  iVar2 = 0;
  if (((byte)pCtx[0x50] & 4) != 0) {
    if (pConfig->bColumnsize == 0) {
      if ((pConfig->zContent == (char *)0x0) || (pConfig->eContent == 3)) {
        if (0 < pConfig->nCol) {
          puVar1 = pConfig->abUnindexed;
          lVar4 = 0;
          do {
            if (puVar1[lVar4] == '\0') {
              *(undefined4 *)(*(long *)(pCtx + 0x10) + lVar4 * 4) = 0xffffffff;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < pConfig->nCol);
        }
        iVar2 = 0;
      }
      else {
        iVar2 = fts5SeekCursor((Fts5Cursor *)pCtx,0);
        if ((iVar2 == 0) && (0 < pConfig->nCol)) {
          lVar5 = 0;
          lVar4 = 0;
          do {
            iVar2 = 0;
            if (pConfig->abUnindexed[lVar4] == '\0') {
              local_40 = (char *)0x0;
              local_44 = 0;
              *(undefined4 *)(*(long *)(pCtx + 0x10) + lVar4 * 4) = 0;
              iVar2 = fts5TextFromStmt(pConfig,*(sqlite3_stmt **)(pCtx + 0x38),(int)lVar4,&local_40,
                                       &local_44);
              if (iVar2 == 0) {
                iVar2 = sqlite3Fts5Tokenize(pConfig,8,local_40,local_44,
                                            (void *)(*(long *)(pCtx + 0x10) + lVar5),
                                            fts5ColumnSizeCb);
              }
              (pConfig->t).pLocale = (char *)0x0;
              (pConfig->t).nLocale = 0;
            }
            if (iVar2 != 0) break;
            lVar4 = lVar4 + 1;
            lVar5 = lVar5 + 4;
          } while (lVar4 < pConfig->nCol);
        }
      }
    }
    else {
      iRowid = fts5CursorRowid((Fts5Cursor *)pCtx);
      iVar2 = sqlite3Fts5StorageDocsize
                        (*(Fts5Storage **)(lVar4 + 0x28),iRowid,*(int **)(pCtx + 0x10));
    }
    pCtx[0x50] = (Fts5Context)((byte)pCtx[0x50] & 0xfb);
  }
  if (iCol < 0) {
    *pnToken = 0;
    if (0 < pConfig->nCol) {
      lVar4 = *(long *)(pCtx + 0x10);
      lVar5 = 0;
      do {
        *pnToken = *pnToken + *(int *)(lVar4 + lVar5 * 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 < pConfig->nCol);
    }
  }
  else {
    if (iCol < pConfig->nCol) {
      iVar3 = *(int *)(*(long *)(pCtx + 0x10) + (ulong)(uint)iCol * 4);
    }
    else {
      iVar2 = 0x19;
      iVar3 = 0;
    }
    *pnToken = iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts5ApiColumnSize(Fts5Context *pCtx, int iCol, int *pnToken){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  Fts5Config *pConfig = pTab->p.pConfig;
  int rc = SQLITE_OK;

  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_DOCSIZE) ){
    if( pConfig->bColumnsize ){
      i64 iRowid = fts5CursorRowid(pCsr);
      rc = sqlite3Fts5StorageDocsize(pTab->pStorage, iRowid, pCsr->aColumnSize);
    }else if( !pConfig->zContent || pConfig->eContent==FTS5_CONTENT_UNINDEXED ){
      int i;
      for(i=0; i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          pCsr->aColumnSize[i] = -1;
        }
      }
    }else{
      int i;
      rc = fts5SeekCursor(pCsr, 0);
      for(i=0; rc==SQLITE_OK && i<pConfig->nCol; i++){
        if( pConfig->abUnindexed[i]==0 ){
          const char *z = 0;
          int n = 0;
          pCsr->aColumnSize[i] = 0;
          rc = fts5TextFromStmt(pConfig, pCsr->pStmt, i, &z, &n);
          if( rc==SQLITE_OK ){
            rc = sqlite3Fts5Tokenize(pConfig, FTS5_TOKENIZE_AUX,
                z, n, (void*)&pCsr->aColumnSize[i], fts5ColumnSizeCb
            );
          }
          sqlite3Fts5ClearLocale(pConfig);
        }
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_DOCSIZE);
  }
  if( iCol<0 ){
    int i;
    *pnToken = 0;
    for(i=0; i<pConfig->nCol; i++){
      *pnToken += pCsr->aColumnSize[i];
    }
  }else if( iCol<pConfig->nCol ){
    *pnToken = pCsr->aColumnSize[iCol];
  }else{
    *pnToken = 0;
    rc = SQLITE_RANGE;
  }
  return rc;
}